

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O0

void __thiscall adios2::Transport::CheckName(Transport *this)

{
  ulong uVar1;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d0 [32];
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string local_88 [39];
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [40];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Toolkit",&local_29);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_61 + 1),"transport::Transport",(allocator *)__lhs)
    ;
    __rhs = (allocator *)&stack0xffffffffffffff77;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"CheckName",__rhs);
    std::operator+((char *)in_stack_ffffffffffffff58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string((string *)(local_61 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return;
}

Assistant:

void Transport::CheckName() const
{
    if (m_Name.empty())
    {
        helper::Throw<std::invalid_argument>("Toolkit", "transport::Transport", "CheckName",
                                             "name can't be empty for " + m_Library +
                                                 " transport ");
    }
}